

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteCircle(ON_BinaryArchive *this,ON_Circle *circle)

{
  ON_3dPoint local_68;
  ON_3dPoint local_50;
  ON_3dPoint local_38;
  bool local_19;
  ON_Circle *pOStack_18;
  bool rc;
  ON_Circle *circle_local;
  ON_BinaryArchive *this_local;
  
  pOStack_18 = circle;
  circle_local = (ON_Circle *)this;
  local_19 = WritePlane(this,&circle->plane);
  if (local_19) {
    local_19 = WriteDouble(this,pOStack_18->radius);
  }
  if (local_19 != false) {
    ON_Circle::PointAt(&local_38,pOStack_18,0.0);
    local_19 = WritePoint(this,&local_38);
  }
  if (local_19 != false) {
    ON_Circle::PointAt(&local_50,pOStack_18,1.5707963267948966);
    local_19 = WritePoint(this,&local_50);
  }
  if (local_19 != false) {
    ON_Circle::PointAt(&local_68,pOStack_18,3.141592653589793);
    local_19 = WritePoint(this,&local_68);
  }
  return local_19;
}

Assistant:

bool 
ON_BinaryArchive::WriteCircle(const ON_Circle& circle)
{
  bool rc = WritePlane( circle.plane );
  if (rc)
    rc = WriteDouble( circle.radius );
  // m_point[] removed 2001, November, 7
  if (rc)
    rc = WritePoint( circle.PointAt(0.0) );
  if (rc)
    rc = WritePoint( circle.PointAt(0.5*ON_PI) );
  if (rc)
    rc = WritePoint( circle.PointAt(ON_PI) );
  /*
  if (rc)
    rc = WritePoint( circle.m_point[0] );
  if (rc)
    rc = WritePoint( circle.m_point[1] );
  if (rc)
    rc = WritePoint( circle.m_point[2] );
  */
  return rc;
}